

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O1

bool __thiscall
ithipublisher::PrintNameList
          (ithipublisher *this,FILE *F,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,double mult)

{
  pointer p_Var1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if ((name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>)._M_impl
      .super__Vector_impl_data._M_finish ==
      (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>)._M_impl
      .super__Vector_impl_data._M_start) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar5 = 0x10;
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        iVar3 = fprintf((FILE *)F,",\n");
        bVar2 = 0 < iVar3;
      }
      p_Var1 = (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar3 = fprintf((FILE *)F,"[\"%s\", %8f, %8f]",*(double *)((long)p_Var1 + lVar5 + -8) * mult,
                      *(double *)((long)&p_Var1->name + lVar5) * mult,
                      *(undefined8 *)((long)p_Var1 + lVar5 + -0x10));
      bVar2 = (bool)(0 < iVar3 & bVar2);
      if (bVar2 == false) {
        return false;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (ulong)(((long)(name_list->
                                    super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(name_list->
                                    super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool ithipublisher::PrintNameList(FILE * F, std::vector<MetricNameLine>* name_list, double mult)
{
    bool ret = true;

    for (size_t i = 0; ret && i < name_list->size(); i++)
    {
        if (i != 0)
        {
            ret = fprintf(F, ",\n") > 0;
        }
        ret &= (fprintf(F, "[\"%s\", %8f, %8f]", 
            (*name_list)[i].name, mult * (*name_list)[i].current, mult * (*name_list)[i].average) > 0);
    }

    return ret;
}